

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetaEvent.cpp
# Opt level: O1

void __thiscall MIDI::MetaEvent::debug(MetaEvent *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tInvalid Meta Event 0x",0x16);
  *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void MetaEvent::debug()
  { 
    cout << "\tInvalid Meta Event 0x" << setbase(16) << (unsigned int)_metaType << endl;
  }